

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer-again.c
# Opt level: O1

int run_test_timer_again(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_timer_t *puVar2;
  long lVar3;
  
  puVar2 = (uv_timer_t *)uv_default_loop();
  start_time = uv_now();
  if (start_time == 0) {
    run_test_timer_again_cold_14();
LAB_00176a75:
    run_test_timer_again_cold_1();
LAB_00176a7a:
    run_test_timer_again_cold_2();
LAB_00176a7f:
    run_test_timer_again_cold_3();
LAB_00176a84:
    run_test_timer_again_cold_4();
LAB_00176a89:
    run_test_timer_again_cold_5();
LAB_00176a8e:
    run_test_timer_again_cold_6();
LAB_00176a93:
    run_test_timer_again_cold_7();
LAB_00176a98:
    run_test_timer_again_cold_8();
LAB_00176a9d:
    run_test_timer_again_cold_9();
LAB_00176aa2:
    run_test_timer_again_cold_10();
  }
  else {
    puVar2 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&dummy);
    if (iVar1 != 0) goto LAB_00176a75;
    puVar2 = &dummy;
    iVar1 = uv_timer_again();
    if (iVar1 != -0x16) goto LAB_00176a7a;
    uv_unref(&dummy);
    puVar2 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&repeat_1);
    if (iVar1 != 0) goto LAB_00176a7f;
    puVar2 = &repeat_1;
    iVar1 = uv_timer_start(&repeat_1,repeat_1_cb,0x32,0);
    if (iVar1 != 0) goto LAB_00176a84;
    puVar2 = &repeat_1;
    lVar3 = uv_timer_get_repeat();
    if (lVar3 != 0) goto LAB_00176a89;
    uv_timer_set_repeat(&repeat_1,0x32);
    puVar2 = &repeat_1;
    lVar3 = uv_timer_get_repeat();
    if (lVar3 != 0x32) goto LAB_00176a8e;
    puVar2 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&repeat_2);
    if (iVar1 != 0) goto LAB_00176a93;
    puVar2 = &repeat_2;
    iVar1 = uv_timer_start(&repeat_2,repeat_2_cb,100,100);
    if (iVar1 != 0) goto LAB_00176a98;
    puVar2 = &repeat_2;
    lVar3 = uv_timer_get_repeat();
    if (lVar3 != 100) goto LAB_00176a9d;
    puVar2 = (uv_timer_t *)uv_default_loop();
    uv_run(puVar2,0);
    if (repeat_1_cb_called != 10) goto LAB_00176aa2;
    if (repeat_2_cb_called == 2) {
      puVar2 = _stderr;
      if (close_cb_called == 2) {
        run_test_timer_again_cold_13();
        return 0;
      }
      goto LAB_00176aac;
    }
  }
  run_test_timer_again_cold_11();
LAB_00176aac:
  run_test_timer_again_cold_12();
  if (puVar2 == &repeat_1) {
    lVar3 = uv_timer_get_repeat(&repeat_1);
    puVar2 = _stderr;
    if (lVar3 == 0x32) {
      repeat_1_cb_cold_3();
      return extraout_EAX;
    }
  }
  else {
    repeat_1_cb_cold_1();
  }
  repeat_1_cb_cold_2();
  if (puVar2 == &repeat_2) {
    puVar2 = _stderr;
    if (repeat_2_cb_allowed != '\0') {
      repeat_2_cb_cold_3();
      return extraout_EAX_00;
    }
  }
  else {
    repeat_2_cb_cold_1();
  }
  repeat_2_cb_cold_2();
  if (puVar2 != (uv_timer_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_01;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(puVar2,0);
  return iVar1;
}

Assistant:

TEST_IMPL(timer_again) {
  int r;

  start_time = uv_now(uv_default_loop());
  ASSERT(0 < start_time);

  /* Verify that it is not possible to uv_timer_again a never-started timer. */
  r = uv_timer_init(uv_default_loop(), &dummy);
  ASSERT(r == 0);
  r = uv_timer_again(&dummy);
  ASSERT(r == UV_EINVAL);
  uv_unref((uv_handle_t*)&dummy);

  /* Start timer repeat_1. */
  r = uv_timer_init(uv_default_loop(), &repeat_1);
  ASSERT(r == 0);
  r = uv_timer_start(&repeat_1, repeat_1_cb, 50, 0);
  ASSERT(r == 0);
  ASSERT(uv_timer_get_repeat(&repeat_1) == 0);

  /* Actually make repeat_1 repeating. */
  uv_timer_set_repeat(&repeat_1, 50);
  ASSERT(uv_timer_get_repeat(&repeat_1) == 50);

  /*
   * Start another repeating timer. It'll be again()ed by the repeat_1 so
   * it should not time out until repeat_1 stops.
   */
  r = uv_timer_init(uv_default_loop(), &repeat_2);
  ASSERT(r == 0);
  r = uv_timer_start(&repeat_2, repeat_2_cb, 100, 100);
  ASSERT(r == 0);
  ASSERT(uv_timer_get_repeat(&repeat_2) == 100);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(repeat_1_cb_called == 10);
  ASSERT(repeat_2_cb_called == 2);
  ASSERT(close_cb_called == 2);

  fprintf(stderr, "Test took %ld ms (expected ~700 ms)\n",
          (long int)(uv_now(uv_default_loop()) - start_time));
  fflush(stderr);

  MAKE_VALGRIND_HAPPY();
  return 0;
}